

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O2

bool __thiscall
libtorrent::aux::session_settings_single_thread::get<bool,std::bitset<72ul>>
          (session_settings_single_thread *this,bitset<72UL> *c,int name,int type)

{
  if ((name & 0xc000U) == type) {
    return (*(ulong *)((long)(c->super__Base_bitset<2UL>)._M_w + (ulong)((name & 0x3fc0U) >> 3)) >>
            ((ulong)(uint)name & 0x3f) & 1) != 0;
  }
  return get<bool,_std::bitset<72UL>_>::empty;
}

Assistant:

T get(Container const& c, int const name, int const type) const
		{
			static typename std::remove_reference<T>::type empty;
			TORRENT_ASSERT((name & settings_pack::type_mask) == type);
			if ((name & settings_pack::type_mask) != type) return empty;
			size_t const index = name & settings_pack::index_mask;
			TORRENT_ASSERT(index < c.size());
			return c[index];
		}